

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O1

Vec_Ptr_t * Llb_NonlinBuildBdds(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper,DdManager *dd)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  int *piVar4;
  DdNode *pDVar5;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  DdNode *f;
  int iVar8;
  long lVar9;
  long lVar10;
  
  pDVar5 = Cudd_ReadOne(dd);
  (p->pConst1->field_5).pData = pDVar5;
  if (0 < vLower->nSize) {
    lVar10 = 0;
    do {
      pvVar3 = vLower->pArray[lVar10];
      pDVar5 = Cudd_bddIthVar(dd,*(int *)((long)pvVar3 + 0x24));
      *(DdNode **)((long)pvVar3 + 0x28) = pDVar5;
      lVar10 = lVar10 + 1;
    } while (lVar10 < vLower->nSize);
  }
  __ptr = Llb_NonlinCutNodes(p,vLower,vUpper);
  if (0 < __ptr->nSize) {
    lVar10 = 0;
    do {
      pvVar3 = __ptr->pArray[lVar10];
      pDVar5 = Cudd_bddAnd(dd,(DdNode *)
                              ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^
                              *(ulong *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x28)
                              ),(DdNode *)
                                ((ulong)((uint)*(ulong *)((long)pvVar3 + 0x10) & 1) ^
                                *(ulong *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) +
                                          0x28)));
      *(DdNode **)((long)pvVar3 + 0x28) = pDVar5;
      if (pDVar5 == (DdNode *)0x0) {
        if (lVar10 != 0) {
          lVar9 = 0;
          do {
            if (__ptr->nSize <= lVar9) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pDVar5 = *(DdNode **)((long)__ptr->pArray[lVar9] + 0x28);
            if (pDVar5 != (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,pDVar5);
            }
            lVar9 = lVar9 + 1;
          } while (lVar10 != lVar9);
        }
        if (__ptr->pArray != (void **)0x0) {
          free(__ptr->pArray);
          __ptr->pArray = (void **)0x0;
        }
        pVVar6 = (Vec_Ptr_t *)0x0;
        goto LAB_0082865d;
      }
      Cudd_Ref(pDVar5);
      lVar10 = lVar10 + 1;
    } while (lVar10 < __ptr->nSize);
  }
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar6->pArray = ppvVar7;
  if (0 < vUpper->nSize) {
    lVar10 = 0;
    do {
      piVar4 = (int *)vUpper->pArray[lVar10];
      if (((uint)*(undefined8 *)(piVar4 + 6) & 7) - 7 < 0xfffffffe) {
        if ((((uint)*(undefined8 *)(piVar4 + 6) & 7) != 3) || (*piVar4 < p->nTruePos)) {
          __assert_fail("Saig_ObjIsLi(p, pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb3Image.c"
                        ,0x244,
                        "Vec_Ptr_t *Llb_NonlinBuildBdds(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, DdManager *)"
                       );
        }
        pDVar5 = (DdNode *)
                 ((ulong)((uint)*(ulong *)(piVar4 + 2) & 1) ^
                 *(ulong *)((*(ulong *)(piVar4 + 2) & 0xfffffffffffffffe) + 0x28));
        f = Cudd_bddIthVar(dd,piVar4[9]);
      }
      else {
        f = Cudd_bddIthVar(dd,piVar4[9]);
        pDVar5 = *(DdNode **)(piVar4 + 10);
      }
      pDVar5 = Cudd_bddXnor(dd,f,pDVar5);
      Cudd_Ref(pDVar5);
      uVar1 = pVVar6->nSize;
      uVar2 = pVVar6->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
          }
          iVar8 = 0x10;
        }
        else {
          iVar8 = uVar2 * 2;
          if (iVar8 <= (int)uVar2) goto LAB_00828591;
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar6->pArray,(ulong)uVar2 << 4);
          }
        }
        pVVar6->pArray = ppvVar7;
        pVVar6->nCap = iVar8;
      }
LAB_00828591:
      pVVar6->nSize = uVar1 + 1;
      pVVar6->pArray[(int)uVar1] = pDVar5;
      lVar10 = lVar10 + 1;
    } while (lVar10 < vUpper->nSize);
  }
  if (0 < __ptr->nSize) {
    lVar10 = 0;
    do {
      Cudd_RecursiveDeref(dd,*(DdNode **)((long)__ptr->pArray[lVar10] + 0x28));
      lVar10 = lVar10 + 1;
    } while (lVar10 < __ptr->nSize);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
LAB_0082865d:
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  return pVVar6;
}

Assistant:

Vec_Ptr_t * Llb_NonlinBuildBdds( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper, DdManager * dd )
{
    Vec_Ptr_t * vNodes, * vResult;
    Aig_Obj_t * pObj;
    DdNode * bBdd0, * bBdd1, * bProd;
    int i, k;

    Aig_ManConst1(p)->pData = Cudd_ReadOne( dd );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Aig_ObjId(pObj) );

    vNodes = Llb_NonlinCutNodes( p, vLower, vUpper );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
//        pObj->pData = Extra_bddAndTime( dd, bBdd0, bBdd1, TimeOut );
        pObj->pData = Cudd_bddAnd( dd, bBdd0, bBdd1 );
        if ( pObj->pData == NULL )
        {
            Vec_PtrForEachEntryStop( Aig_Obj_t *, vNodes, pObj, k, i )
                if ( pObj->pData )
                    Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
            Vec_PtrFree( vNodes );
            return NULL;
        }
        Cudd_Ref( (DdNode *)pObj->pData );
    }

    vResult = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
        {
            bProd = Cudd_bddXnor( dd, Cudd_bddIthVar(dd, Aig_ObjId(pObj)), (DdNode *)pObj->pData );  Cudd_Ref( bProd );
        }
        else
        {
            assert( Saig_ObjIsLi(p, pObj) );
            bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
            bProd = Cudd_bddXnor( dd, Cudd_bddIthVar(dd, Aig_ObjId(pObj)), bBdd0 );                  Cudd_Ref( bProd );
        }
        Vec_PtrPush( vResult, bProd );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );

    Vec_PtrFree( vNodes );
    return vResult;
}